

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O2

void __thiscall HighsCutGeneration::flipComplementation(HighsCutGeneration *this,HighsInt index)

{
  pointer puVar1;
  pointer pdVar2;
  pointer pdVar3;
  
  puVar1 = (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1[index] = '\x01' - puVar1[index];
  pdVar2 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3[index] = pdVar2[index] - pdVar3[index];
  HighsCDouble::operator-=(&this->rhs,pdVar2[index] * this->vals[index]);
  this->vals[index] = -this->vals[index];
  return;
}

Assistant:

void HighsCutGeneration::flipComplementation(HighsInt index) {
  // only variables with finite upper bounds can be complemented
  assert(upper[index] != kHighsInf);

  // flip complementation
  complementation[index] = 1 - complementation[index];
  solval[index] = upper[index] - solval[index];
  rhs -= upper[index] * vals[index];
  vals[index] = -vals[index];
}